

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O0

void __thiscall Renderer::Render(Renderer *this,Snake *snake,Snake *snake2,SDL_Point *food)

{
  bool bVar1;
  reference pSVar2;
  SDL_Point *point_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<SDL_Point,_std::allocator<SDL_Point>_> *__range1_1;
  SDL_Point *point;
  const_iterator __end1;
  const_iterator __begin1;
  vector<SDL_Point,_std::allocator<SDL_Point>_> *__range1;
  SDL_Rect block;
  SDL_Point *food_local;
  Snake *snake2_local;
  Snake *snake_local;
  Renderer *this_local;
  
  block.x = (int)(this->screen_width / this->grid_width);
  block.y = (int)(this->screen_height / this->grid_height);
  block._8_8_ = food;
  SDL_SetRenderDrawColor(this->sdl_renderer,0x1e,0x1e,0x1e,0xff);
  SDL_RenderClear(this->sdl_renderer);
  SDL_SetRenderDrawColor(this->sdl_renderer,0xff,0xcc,0);
  __range1._0_4_ = *(int *)block._8_8_ * block.x;
  __range1._4_4_ = *(int *)(block._8_8_ + 4) * block.y;
  SDL_RenderFillRect(this->sdl_renderer,&__range1);
  SDL_SetRenderDrawColor(this->sdl_renderer,0xff,0xff,0xff);
  __end1 = std::vector<SDL_Point,_std::allocator<SDL_Point>_>::begin(&snake->body);
  point = (SDL_Point *)std::vector<SDL_Point,_std::allocator<SDL_Point>_>::end(&snake->body);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_SDL_Point_*,_std::vector<SDL_Point,_std::allocator<SDL_Point>_>_>
                                *)&point);
    if (!bVar1) break;
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_SDL_Point_*,_std::vector<SDL_Point,_std::allocator<SDL_Point>_>_>
             ::operator*(&__end1);
    __range1._0_4_ = pSVar2->x * block.x;
    __range1._4_4_ = pSVar2->y * block.y;
    SDL_RenderFillRect(this->sdl_renderer,&__range1);
    __gnu_cxx::
    __normal_iterator<const_SDL_Point_*,_std::vector<SDL_Point,_std::allocator<SDL_Point>_>_>::
    operator++(&__end1);
  }
  __range1._0_4_ = (int)snake->head_x * block.x;
  __range1._4_4_ = (int)snake->head_y * block.y;
  if ((snake->alive & 1U) == 0) {
    SDL_SetRenderDrawColor(this->sdl_renderer,0xff,0);
  }
  else {
    SDL_SetRenderDrawColor(this->sdl_renderer,0,0x7a,0xcc,0xff);
  }
  SDL_RenderFillRect(this->sdl_renderer,&__range1);
  SDL_SetRenderDrawColor(this->sdl_renderer,0xff,0xff,0xff);
  __end1_1 = std::vector<SDL_Point,_std::allocator<SDL_Point>_>::begin(&snake2->body);
  point_1 = (SDL_Point *)std::vector<SDL_Point,_std::allocator<SDL_Point>_>::end(&snake2->body);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<const_SDL_Point_*,_std::vector<SDL_Point,_std::allocator<SDL_Point>_>_>
                        *)&point_1);
    if (!bVar1) break;
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_SDL_Point_*,_std::vector<SDL_Point,_std::allocator<SDL_Point>_>_>
             ::operator*(&__end1_1);
    __range1._0_4_ = pSVar2->x * block.x;
    __range1._4_4_ = pSVar2->y * block.y;
    SDL_RenderFillRect(this->sdl_renderer,&__range1);
    __gnu_cxx::
    __normal_iterator<const_SDL_Point_*,_std::vector<SDL_Point,_std::allocator<SDL_Point>_>_>::
    operator++(&__end1_1);
  }
  __range1._0_4_ = (int)snake2->head_x * block.x;
  __range1._4_4_ = (int)snake2->head_y * block.y;
  if ((snake2->alive & 1U) == 0) {
    SDL_SetRenderDrawColor(this->sdl_renderer,0xff,0);
  }
  else {
    SDL_SetRenderDrawColor(this->sdl_renderer,0,0x7a,0xcc,0xff);
  }
  SDL_RenderFillRect(this->sdl_renderer,&__range1);
  SDL_RenderPresent(this->sdl_renderer);
  return;
}

Assistant:

void Renderer::Render(Snake const snake, Snake const snake2, SDL_Point const &food) {
  SDL_Rect block;
  block.w = screen_width / grid_width;
  block.h = screen_height / grid_height;

  // Clear screen
  SDL_SetRenderDrawColor(sdl_renderer, 0x1E, 0x1E, 0x1E, 0xFF);
  SDL_RenderClear(sdl_renderer);

  // Render food
  SDL_SetRenderDrawColor(sdl_renderer, 0xFF, 0xCC, 0x00, 0xFF);
  block.x = food.x * block.w;
  block.y = food.y * block.h;
  SDL_RenderFillRect(sdl_renderer, &block);

  // Render snake's body
  SDL_SetRenderDrawColor(sdl_renderer, 0xFF, 0xFF, 0xFF, 0xFF);
  for (SDL_Point const &point : snake.body) {
    block.x = point.x * block.w;
    block.y = point.y * block.h;
    SDL_RenderFillRect(sdl_renderer, &block);
  }

  // Render snake's head
  block.x = static_cast<int>(snake.head_x) * block.w;
  block.y = static_cast<int>(snake.head_y) * block.h;
  if (snake.alive) {
    SDL_SetRenderDrawColor(sdl_renderer, 0x00, 0x7A, 0xCC, 0xFF);
  } else {
    SDL_SetRenderDrawColor(sdl_renderer, 0xFF, 0x00, 0x00, 0xFF);
  }
  SDL_RenderFillRect(sdl_renderer, &block);
  
  // Render snake2's body
  SDL_SetRenderDrawColor(sdl_renderer, 0xFF, 0xFF, 0xFF, 0xFF);
  for (SDL_Point const &point : snake2.body) {
    block.x = point.x * block.w;
    block.y = point.y * block.h;
    SDL_RenderFillRect(sdl_renderer, &block);
  }

  // Render snake2's head
  block.x = static_cast<int>(snake2.head_x) * block.w;
  block.y = static_cast<int>(snake2.head_y) * block.h;
  if (snake2.alive) {
    SDL_SetRenderDrawColor(sdl_renderer, 0x00, 0x7A, 0xCC, 0xFF);
  } else {
    SDL_SetRenderDrawColor(sdl_renderer, 0xFF, 0x00, 0x00, 0xFF);
  }
  SDL_RenderFillRect(sdl_renderer, &block);
  
  // Update Screen
  SDL_RenderPresent(sdl_renderer);
}